

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeHandler.cpp
# Opt level: O0

Var __thiscall
Js::DynamicTypeHandler::GetSlot(DynamicTypeHandler *this,DynamicObject *instance,int index)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  WriteBarrierPtr<void> **ppWVar4;
  void **ppvVar5;
  Var value_1;
  Var value;
  Var *slots;
  int index_local;
  DynamicObject *instance_local;
  DynamicTypeHandler *this_local;
  
  if (index < (int)(uint)this->inlineSlotCapacity) {
    this_local = *(DynamicTypeHandler **)
                  ((long)&(&(instance->super_RecyclableObject).super_FinalizableObject)[index].
                          super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject +
                  (ulong)this->offsetOfInlineSlots);
    bVar2 = ThreadContext::IsOnStack(instance);
    if (((!bVar2) && (bVar2 = ThreadContext::IsOnStack(this_local), bVar2)) &&
       (bVar2 = TaggedNumber::Is(this_local), !bVar2)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/TypeHandler.cpp"
                                  ,0x5a,
                                  "(ThreadContext::IsOnStack(instance) || !ThreadContext::IsOnStack(value) || TaggedNumber::Is(value))"
                                  ,
                                  "ThreadContext::IsOnStack(instance) || !ThreadContext::IsOnStack(value) || TaggedNumber::Is(value)"
                                 );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
  }
  else {
    ppWVar4 = Memory::WriteBarrierPtr::operator_cast_to_WriteBarrierPtr__
                        ((WriteBarrierPtr *)&instance->auxSlots);
    ppvVar5 = Memory::WriteBarrierPtr::operator_cast_to_void__
                        ((WriteBarrierPtr *)
                         (*ppWVar4 + (int)(index - (uint)this->inlineSlotCapacity)));
    this_local = (DynamicTypeHandler *)*ppvVar5;
    bVar2 = ThreadContext::IsOnStack(instance);
    if (((!bVar2) && (bVar2 = ThreadContext::IsOnStack(this_local), bVar2)) &&
       (bVar2 = TaggedNumber::Is(this_local), !bVar2)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/TypeHandler.cpp"
                                  ,0x60,
                                  "(ThreadContext::IsOnStack(instance) || !ThreadContext::IsOnStack(value) || TaggedNumber::Is(value))"
                                  ,
                                  "ThreadContext::IsOnStack(instance) || !ThreadContext::IsOnStack(value) || TaggedNumber::Is(value)"
                                 );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
  }
  return this_local;
}

Assistant:

Var DynamicTypeHandler::GetSlot(DynamicObject * instance, int index)
    {
        if (index < inlineSlotCapacity)
        {
            Var * slots = reinterpret_cast<Var*>(reinterpret_cast<size_t>(instance) + offsetOfInlineSlots);
            Var value = slots[index];
            Assert(ThreadContext::IsOnStack(instance) || !ThreadContext::IsOnStack(value) || TaggedNumber::Is(value));
            return value;
        }
        else
        {
            Var value = instance->auxSlots[index - inlineSlotCapacity];
            Assert(ThreadContext::IsOnStack(instance) || !ThreadContext::IsOnStack(value) || TaggedNumber::Is(value));
            return value;
        }
    }